

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitStructGet(FunctionValidator *this,StructGet *curr)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  Module *pMVar4;
  Struct *this_00;
  size_type sVar5;
  const_reference pvVar6;
  bool local_59;
  BasicType local_48 [2];
  Type local_40;
  value_type field;
  FieldList *fields;
  StructGet *local_18;
  StructGet *curr_local;
  FunctionValidator *this_local;
  
  local_18 = curr;
  curr_local = (StructGet *)this;
  pMVar4 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  bVar2 = FeatureSet::hasGC(&pMVar4->features);
  shouldBeTrue<wasm::StructGet*>(this,bVar2,local_18,"struct.get requires gc [--enable-gc]");
  fields._4_4_ = 1;
  bVar2 = wasm::Type::operator==
                    (&(local_18->super_SpecificExpression<(wasm::Expression::Id)61>).
                      super_Expression.type,(BasicType *)((long)&fields + 4));
  local_59 = true;
  if (!bVar2) {
    local_59 = wasm::Type::isNull(&local_18->ref->type);
  }
  if (local_59 == false) {
    bVar2 = wasm::Type::isStruct(&local_18->ref->type);
    bVar2 = shouldBeTrue<wasm::Expression*>
                      (this,bVar2,local_18->ref,"struct.get ref must be a struct");
    if (bVar2) {
      field._8_8_ = wasm::Type::getHeapType(&local_18->ref->type);
      this_00 = HeapType::getStruct((HeapType *)&field.packedType);
      uVar1 = local_18->index;
      sVar5 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(&this_00->fields);
      shouldBeTrue<wasm::StructGet*>(this,uVar1 < sVar5,local_18,"bad struct.get field");
      pvVar6 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[]
                         (&this_00->fields,(ulong)local_18->index);
      local_40.id = (pvVar6->type).id;
      field.type.id._0_4_ = pvVar6->packedType;
      field.type.id._4_4_ = pvVar6->mutable_;
      local_48[1] = 2;
      bVar3 = wasm::Type::operator!=(&local_40,local_48 + 1);
      bVar2 = true;
      if (!bVar3) {
        bVar2 = (int)field.type.id == 0;
      }
      if (bVar2) {
        shouldBeFalse<wasm::StructGet*>
                  (this,(bool)(local_18->signed_ & 1),local_18,"non-packed get cannot be signed");
      }
      local_48[0] = unreachable;
      bVar2 = wasm::Type::operator==(&local_18->ref->type,local_48);
      if (!bVar2) {
        shouldBeEqual<wasm::StructGet*,wasm::Type>
                  (this,(Type)(local_18->super_SpecificExpression<(wasm::Expression::Id)61>).
                              super_Expression.type.id,local_40,local_18,
                   "struct.get must have the proper type");
      }
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitStructGet(StructGet* curr) {
  shouldBeTrue(getModule()->features.hasGC(),
               curr,
               "struct.get requires gc [--enable-gc]");
  if (curr->type == Type::unreachable || curr->ref->type.isNull()) {
    return;
  }
  if (!shouldBeTrue(curr->ref->type.isStruct(),
                    curr->ref,
                    "struct.get ref must be a struct")) {
    return;
  }
  const auto& fields = curr->ref->type.getHeapType().getStruct().fields;
  shouldBeTrue(curr->index < fields.size(), curr, "bad struct.get field");
  auto field = fields[curr->index];
  // If the type is not packed, it must be marked internally as unsigned, by
  // convention.
  if (field.type != Type::i32 || field.packedType == Field::not_packed) {
    shouldBeFalse(curr->signed_, curr, "non-packed get cannot be signed");
  }
  if (curr->ref->type == Type::unreachable) {
    return;
  }
  shouldBeEqual(
    curr->type, field.type, curr, "struct.get must have the proper type");
}